

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

void * findrelpos234(tree234 *t,void *e,cmpfn234 cmp,int relation,int *index)

{
  bool local_7a;
  uint local_78;
  uint local_74;
  int cmpret;
  void *toret;
  undefined1 auStack_60 [3];
  _Bool equal_permitted;
  int reldir;
  search234_state ss;
  int *index_local;
  cmpfn234 p_Stack_28;
  int relation_local;
  cmpfn234 cmp_local;
  void *e_local;
  tree234 *t_local;
  
  if ((relation == 1) || (relation == 2)) {
    local_78 = 0xffffffff;
  }
  else {
    local_78 = (uint)(relation == 3 || relation == 4);
  }
  local_7a = relation != 1 && relation != 3;
  ss._node = index;
  if ((relation != 1 && relation != 3) && (e == (void *)0x0)) {
    __assert_fail("!(equal_permitted && !e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tree234.c"
                  ,0x218,"void *findrelpos234(tree234 *, void *, cmpfn234, int, int *)");
  }
  p_Stack_28 = cmp;
  if (cmp == (cmpfn234)0x0) {
    p_Stack_28 = t->cmp;
  }
  search234_start((search234_state *)auStack_60,t);
  do {
    if (_auStack_60 == (void *)0x0) {
      if (relation == 0) {
        t_local = (tree234 *)0x0;
      }
      else {
        if ((relation == 1) || (relation == 2)) {
          ss.element._0_4_ = (int)ss.element + -1;
        }
        t_local = (tree234 *)index234(t,(int)ss.element);
        if ((t_local != (tree234 *)0x0) && (ss._node != (void *)0x0)) {
          *(int *)ss._node = (int)ss.element;
        }
      }
      return t_local;
    }
    if (e == (void *)0x0) {
      local_74 = -local_78;
    }
    else {
      local_74 = (*p_Stack_28)(e,_auStack_60);
    }
    if (local_74 == 0) {
      if (local_7a) {
        if (ss._node != (void *)0x0) {
          *(int *)ss._node = (int)ss.element;
        }
        return _auStack_60;
      }
      local_74 = local_78;
    }
    search234_step((search234_state *)auStack_60,local_74);
  } while( true );
}

Assistant:

void *findrelpos234(tree234 * t, void *e, cmpfn234 cmp,
                    int relation, int *index)
{
    search234_state ss;
    int reldir = (relation == REL234_LT || relation == REL234_LE ? -1 :
                  relation == REL234_GT || relation == REL234_GE ? +1 : 0);
    bool equal_permitted = (relation != REL234_LT && relation != REL234_GT);
    void *toret;

    /* Only LT / GT relations are permitted with a null query element. */
    assert(!(equal_permitted && !e));

    if (cmp == NULL)
        cmp = t->cmp;

    search234_start(&ss, t);
    while (ss.element) {
        int cmpret;

        if (e) {
            cmpret = cmp(e, ss.element);
        } else {
            cmpret = -reldir;          /* invent a fixed compare result */
        }

        if (cmpret == 0) {
            /*
             * We've found an element that compares exactly equal to
             * the query element.
             */
            if (equal_permitted) {
                /* If our search relation permits equality, we've
                 * finished already. */
                if (index)
                    *index = ss.index;
                return ss.element;
            } else {
                /* Otherwise, pretend this element was slightly too
                 * big/small, according to the direction of search. */
                cmpret = reldir;
            }
        }

        search234_step(&ss, cmpret);
    }

    /*
     * No element compares equal to the one we were after, but
     * ss.index indicates the index that element would have if it were
     * inserted.
     *
     * So if our search relation is EQ, we must simply return failure.
     */
    if (relation == REL234_EQ)
        return NULL;

    /*
     * Otherwise, we must do an index lookup for the previous index
     * (if we're going left - LE or LT) or this index (if we're going
     * right - GE or GT).
     */
    if (relation == REL234_LT || relation == REL234_LE) {
        ss.index--;
    }

    /*
     * We know the index of the element we want; just call index234
     * to do the rest. This will return NULL if the index is out of
     * bounds, which is exactly what we want.
     */
    toret = index234(t, ss.index);
    if (toret && index)
        *index = ss.index;
    return toret;
}